

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2d.cpp
# Opt level: O0

Matrix<int,_4UL,_4UL> __thiscall
Matrix<int,6ul,6ul>::conv<3ul,3ul>(Matrix<int,6ul,6ul> *this,Matrix<int,_3UL,_3UL> *kernel)

{
  int iVar1;
  int *piVar2;
  Matrix<int,_3UL,_3UL> *in_RDX;
  uint local_40;
  uint local_3c;
  int j;
  int i;
  Matrix<int,_4UL,_4UL> result;
  size_t nc;
  size_t nr;
  Matrix<int,_3UL,_3UL> *kernel_local;
  Matrix<int,_6UL,_6UL> *this_local;
  
  result.elements._M_t.
  super___uniq_ptr_impl<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>._M_t.
  super__Tuple_impl<0UL,_std::array<int,_16UL>_*,_std::default_delete<std::array<int,_16UL>_>_>.
  super__Head_base<0UL,_std::array<int,_16UL>_*,_false>._M_head_impl =
       (unique_ptr<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>)
       (__uniq_ptr_data<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>,_true,_true>
        )0x4;
  Matrix<int,_4UL,_4UL>::Matrix((Matrix<int,_4UL,_4UL> *)&j);
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
      iVar1 = conv_op<3ul,3ul>((Matrix<int,6ul,6ul> *)kernel,in_RDX,(long)(int)local_3c,
                               (long)(int)local_40);
      piVar2 = Matrix<int,_4UL,_4UL>::at
                         ((Matrix<int,_4UL,_4UL> *)&j,(long)(int)local_3c,(long)(int)local_40);
      *piVar2 = iVar1;
    }
  }
  Matrix<int,_4UL,_4UL>::Matrix((Matrix<int,_4UL,_4UL> *)this,(Matrix<int,_4UL,_4UL> *)&j);
  Matrix<int,_4UL,_4UL>::~Matrix((Matrix<int,_4UL,_4UL> *)&j);
  return (unique_ptr<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>)
         (unique_ptr<std::array<int,_16UL>,_std::default_delete<std::array<int,_16UL>_>_>)this;
}

Assistant:

auto conv(const Matrix<T, KRow, KCol> &kernel) {
    static_assert(Row >= KRow and Col >= KCol, "kernel size miss matched");
    constexpr size_t nr = Row - KRow + 1, nc = Col - KCol + 1;
    Matrix<T, nr, nc> result;
    for (auto i = 0; i < nr; ++i) {
      for (auto j = 0; j < nc; ++j) {
        result.at(i, j) = conv_op(kernel, i, j);
      }
    }
    return result;
  }